

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorType.cpp
# Opt level: O3

bool __thiscall Kernel::OperatorType::isSingleSortType(OperatorType *this,TermList srt)

{
  TermList TVar1;
  OperatorKey *pOVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  pOVar2 = this->_key;
  iVar3 = (int)*(undefined8 *)pOVar2;
  iVar4 = this->_typeArgsArity + iVar3;
  if (iVar4 != 1) {
    uVar5 = 0;
    do {
      if (uVar5 < this->_typeArgsArity) {
        TVar1 = AtomicSort::superSort();
      }
      else {
        TVar1._content = *(uint64_t *)(this->_key + (ulong)(uVar5 - this->_typeArgsArity) * 8 + 8);
      }
      if (TVar1._content != srt._content) {
        return false;
      }
      uVar5 = uVar5 + 1;
    } while (iVar4 - 1U != uVar5);
    pOVar2 = this->_key;
    iVar3 = (int)*(undefined8 *)pOVar2;
  }
  return *(uint64_t *)(pOVar2 + ((ulong)(iVar3 - 1) + 1) * 8) == srt._content ||
         ((uint)*(uint64_t *)(pOVar2 + ((ulong)(iVar3 - 1) + 1) * 8) & 3) == 2;
}

Assistant:

bool OperatorType::isSingleSortType(TermList srt) const
{
  unsigned len = arity();
  for (unsigned i = 0; i <len; i++) {
    if (arg(i) != srt) { //term comparison with != should be OK on the basis that both are shared terms
      return false;
    }
  }

  if (isFunctionType() && result() != srt) { 
    return false;
  }

  return true;
}